

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O3

void __thiscall Js::ScriptFunction::PrepareForConversionToNonPathType(ScriptFunction *this)

{
  ProxyEntryPointInfo *newEntryPointInfo;
  RecyclerWeakReference<Js::ScriptFunctionType> *pRVar1;
  Type pcVar2;
  ScriptFunctionType *pSVar3;
  int iVar4;
  FunctionProxy *this_00;
  FunctionTypeWeakRefList *pFVar5;
  long lVar6;
  
  newEntryPointInfo =
       (ProxyEntryPointInfo *)
       (this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
       super_RecyclableObject.type.ptr[1].prototype.ptr;
  this_00 = GetFunctionProxy(this);
  pFVar5 = FunctionProxy::GetFunctionObjectTypeList(this_00);
  if (pFVar5 != (FunctionTypeWeakRefList *)0x0) {
    iVar4 = (pFVar5->
            super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
            ).count;
    if (0 < iVar4) {
      lVar6 = 0;
      do {
        pRVar1 = (pFVar5->
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
                 ).buffer.ptr[lVar6].ptr;
        if ((((ulong)pRVar1 & 1) == 0 &&
             pRVar1 != (RecyclerWeakReference<Js::ScriptFunctionType> *)0x0) &&
           (pcVar2 = (pRVar1->super_RecyclerWeakReferenceBase).strongRef, pcVar2 != (Type)0x0)) {
          CopyEntryPointInfoToThreadContextIfNecessary
                    (*(ProxyEntryPointInfo **)(pcVar2 + 0x38),newEntryPointInfo);
          iVar4 = (pFVar5->
                  super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
                  ).count;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar4);
    }
  }
  pSVar3 = (this_00->deferredPrototypeType).ptr;
  if (pSVar3 != (ScriptFunctionType *)0x0) {
    CopyEntryPointInfoToThreadContextIfNecessary((pSVar3->entryPointInfo).ptr,newEntryPointInfo);
  }
  pSVar3 = (this_00->undeferredFunctionType).ptr;
  if (pSVar3 != (ScriptFunctionType *)0x0) {
    CopyEntryPointInfoToThreadContextIfNecessary((pSVar3->entryPointInfo).ptr,newEntryPointInfo);
    return;
  }
  return;
}

Assistant:

void ScriptFunction::PrepareForConversionToNonPathType()
    {
        // We have a path type handler that is currently responsible for holding some number of entry point infos alive.
        // The last one will be copied on to the new dictionary type handler, but if any previous instances in the path
        // are holding different entry point infos, those need to be copied to somewhere safe.
        // The number of entry points is likely low compared to length of path, so iterate those instead.

        ProxyEntryPointInfo* entryPointInfo = this->GetScriptFunctionType()->GetEntryPointInfo();

        this->GetFunctionProxy()->MapFunctionObjectTypes([&](ScriptFunctionType* functionType)
        {
            CopyEntryPointInfoToThreadContextIfNecessary(functionType->GetEntryPointInfo(), entryPointInfo);
        });
    }